

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void OPL_STATUS_RESET(FM_OPL *OPL,int flag)

{
  int flag_local;
  FM_OPL *OPL_local;
  
  OPL->status = OPL->status & ((byte)flag ^ 0xff);
  if ((((OPL->status & 0x80) != 0) && ((OPL->status & OPL->statusmask) == 0)) &&
     (OPL->status = OPL->status & 0x7f, OPL->IRQHandler != (OPL_IRQHANDLER)0x0)) {
    (*OPL->IRQHandler)(OPL->IRQParam,'\0');
  }
  return;
}

Assistant:

INLINE void OPL_STATUS_RESET(FM_OPL *OPL,int flag)
{
	/* reset status flag */
	OPL->status &=~flag;
	if((OPL->status & 0x80))
	{
		if (!(OPL->status & OPL->statusmask) )
		{
			OPL->status &= 0x7f;
			/* callback user interrupt handler (IRQ is ON to OFF) */
			if(OPL->IRQHandler) (OPL->IRQHandler)(OPL->IRQParam,0);
		}
	}
}